

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionArgumentPushConstant
          (ValidationState_t *_,Instruction *inst)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  spv_result_t sVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  DiagnosticStream DStack_1f8;
  
  psVar1 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar2 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = ValidateKernelDecl(_,inst);
  if (sVar4 == SPV_SUCCESS) {
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar3 = IsUint32Constant(_,uVar5);
    if (bVar3) {
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,6);
      bVar3 = IsUint32Constant(_,uVar5);
      if (bVar3) {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,7);
        bVar3 = IsUint32Constant(_,uVar5);
        if (bVar3) {
          if (((long)psVar1 - (long)psVar2 == 0x90) &&
             (sVar4 = ValidateArgInfo(_,inst,8), sVar4 != SPV_SUCCESS)) {
            return sVar4;
          }
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar7 = "Size must be a 32-bit unsigned integer OpConstant";
        lVar6 = 0x31;
      }
      else {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar7 = "Offset must be a 32-bit unsigned integer OpConstant";
        lVar6 = 0x33;
      }
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar7 = "Ordinal must be a 32-bit unsigned integer OpConstant";
      lVar6 = 0x34;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar7,lVar6);
    DiagnosticStream::~DiagnosticStream(&DStack_1f8);
    sVar4 = DStack_1f8.error_;
  }
  return sVar4;
}

Assistant:

spv_result_t ValidateClspvReflectionArgumentPushConstant(
    ValidationState_t& _, const Instruction* inst) {
  const auto num_operands = inst->operands().size();
  if (auto error = ValidateKernelDecl(_, inst)) {
    return error;
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Ordinal must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Offset must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  if (num_operands == 9) {
    if (auto error = ValidateArgInfo(_, inst, 8)) {
      return error;
    }
  }

  return SPV_SUCCESS;
}